

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWArray.h
# Opt level: O0

void __thiscall
COLLADAFW::Array<COLLADAFW::TextureCoordinateBinding>::releaseMemory
          (Array<COLLADAFW::TextureCoordinateBinding> *this)

{
  TextureCoordinateBinding *pTVar1;
  long lVar2;
  TextureCoordinateBinding *pTVar3;
  Array<COLLADAFW::TextureCoordinateBinding> *in_RDI;
  
  pTVar1 = in_RDI->mData;
  if (pTVar1 != (TextureCoordinateBinding *)0x0) {
    lVar2 = *(long *)((long)&pTVar1[-1].mSemantic.field_2 + 8);
    for (pTVar3 = pTVar1 + lVar2; pTVar1 != pTVar3; pTVar3 = pTVar3 + -1) {
      TextureCoordinateBinding::~TextureCoordinateBinding((TextureCoordinateBinding *)0xc45ba2);
    }
    operator_delete__((void *)((long)&pTVar1[-1].mSemantic.field_2 + 8),lVar2 * 0x38 + 8);
  }
  setData(in_RDI,(TextureCoordinateBinding *)0x0,0,0);
  return;
}

Assistant:

virtual void releaseMemory ()
        {
            delete[] mData;
            setData ( 0, 0, 0 );
        }